

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  Orphanage OVar4;
  Reader RVar5;
  Builder root;
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder builder;
  StructBuilder local_170;
  OrphanBuilder local_148;
  ArrayPtr<const_unsigned_char> local_128;
  WirePointer *local_118;
  Builder local_110;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  OVar4 = MessageBuilder::getOrphanage(&local_f8.super_MessageBuilder);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&local_170,(EVP_PKEY_CTX *)OVar4.arena);
  local_148.capTable = (CapTableBuilder *)local_170.data;
  local_148.location = (word *)local_170.pointers;
  local_148.tag.content = (uint64_t)local_170.segment;
  local_148.segment = (SegmentBuilder *)local_170.capTable;
  RVar5 = OrphanBuilder::asDataReader(&local_148);
  if (RVar5.super_ArrayPtr<const_unsigned_char>.size_ == 3) {
    if (*RVar5.super_ArrayPtr<const_unsigned_char>.ptr == 'f') {
      uVar1 = 0;
      do {
        uVar2 = uVar1;
        if (uVar2 == 2) break;
        uVar1 = uVar2 + 1;
      } while ("foo"[uVar2 + 1] == RVar5.super_ArrayPtr<const_unsigned_char>.ptr[uVar2 + 1]);
      bVar3 = 1 < uVar2;
    }
    else {
      bVar3 = false;
    }
    if (bVar3) goto LAB_001fc878;
  }
  if (kj::_::Debug::minSeverity < 3) {
    local_170.segment = (SegmentBuilder *)0x2be152;
    local_170.capTable = (CapTableBuilder *)0x3;
    local_128 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&local_148);
    kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x119,ERROR,
               "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", data(\"foo\"), orphan.getReader()"
               ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
               (Reader *)&local_170,(Reader *)&local_128);
  }
LAB_001fc878:
  MessageBuilder::getRootInternal(&local_110,&local_f8.super_MessageBuilder);
  local_118 = local_110.builder.pointer;
  PointerBuilder::initStruct(&local_170,(PointerBuilder *)&local_128,(StructSize)0x140006);
  local_118 = local_170.pointers + 1;
  local_128.size_ = (size_t)local_170.capTable;
  local_128.ptr = (uchar *)local_170.segment;
  PointerBuilder::adopt((PointerBuilder *)&local_128,&local_148);
  if (local_148.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_148);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}